

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void test_close_impl(char *file,int line,int sock)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  int rc;
  int sock_local;
  int line_local;
  char *file_local;
  
  iVar1 = nn_close(sock);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 9) {
      piVar2 = __errno_location();
      __stream = _stderr;
      if (*piVar2 != 0x9523dfd) {
        piVar2 = __errno_location();
        pcVar3 = nn_err_strerror(*piVar2);
        puVar4 = (uint *)__errno_location();
        fprintf(__stream,"Failed to close socket: %s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,file,
                (ulong)(uint)line);
        nn_err_abort();
      }
    }
  }
  return;
}

Assistant:

static void NN_UNUSED test_close_impl (char *file, int line, int sock)
{
    int rc;

    rc = nn_close (sock);
    if ((rc != 0) && (errno != EBADF && errno != ETERM)) {
        fprintf (stderr, "Failed to close socket: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
}